

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *this;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  bool bVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  long local_fc0;
  ulong local_fb8;
  long local_fb0;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar1 = (context->query_radius).field_0.m128[0];
  auVar25 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_ff8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_ff8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  pauVar21 = (undefined1 (*) [16])local_f68;
  fVar2 = (query->p).field_0.field_0.x;
  auVar32._4_4_ = fVar2;
  auVar32._0_4_ = fVar2;
  auVar32._8_4_ = fVar2;
  auVar32._12_4_ = fVar2;
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_f88._4_4_ = uVar3;
  local_f88._0_4_ = uVar3;
  local_f88._8_4_ = uVar3;
  local_f88._12_4_ = uVar3;
  auVar35 = ZEXT1664(local_f88);
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fe8._4_4_ = uVar3;
  local_fe8._0_4_ = uVar3;
  local_fe8._8_4_ = uVar3;
  local_fe8._12_4_ = uVar3;
  auVar33 = ZEXT1664(local_fe8);
  local_f98 = (context->query_radius).field_0.m128[1];
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = (context->query_radius).field_0.m128[2];
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  auVar23 = vshufps_avx(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar1)),0);
  bVar15 = false;
LAB_011e15e6:
  local_fd8 = auVar25._0_16_;
  auVar10 = vsubps_avx(auVar32,local_fd8);
  auVar24._0_4_ = fVar2 + auVar25._0_4_;
  auVar24._4_4_ = fVar2 + auVar25._4_4_;
  auVar24._8_4_ = fVar2 + auVar25._8_4_;
  auVar24._12_4_ = fVar2 + auVar25._12_4_;
  auVar11._4_4_ = fStack_f94;
  auVar11._0_4_ = local_f98;
  auVar11._8_4_ = fStack_f90;
  auVar11._12_4_ = fStack_f8c;
  auVar34 = auVar35._0_16_;
  auVar11 = vsubps_avx(auVar34,auVar11);
  auVar26._0_4_ = auVar35._0_4_ + local_f98;
  auVar26._4_4_ = auVar35._4_4_ + fStack_f94;
  auVar26._8_4_ = auVar35._8_4_ + fStack_f90;
  auVar26._12_4_ = auVar35._12_4_ + fStack_f8c;
  auVar12._4_4_ = fStack_fa4;
  auVar12._0_4_ = local_fa8;
  auVar12._8_4_ = fStack_fa0;
  auVar12._12_4_ = fStack_f9c;
  auVar12 = vsubps_avx(auVar33._0_16_,auVar12);
  auVar27._0_4_ = auVar33._0_4_ + local_fa8;
  auVar27._4_4_ = auVar33._4_4_ + fStack_fa4;
  auVar27._8_4_ = auVar33._8_4_ + fStack_fa0;
  auVar27._12_4_ = auVar33._12_4_ + fStack_f9c;
  while( true ) {
    pauVar13 = pauVar21 + -1;
    pauVar21 = pauVar21 + -1;
    if ((float)local_ff8._0_4_ < *(float *)(*pauVar13 + 8)) break;
    uVar17 = *(ulong *)*pauVar21;
LAB_011e1630:
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar17 & 8) != 0) {
LAB_011e1964:
        local_fc0 = (ulong)((uint)uVar17 & 0xf) - 8;
        if (local_fc0 == 0) break;
        lVar19 = (uVar17 & 0xfffffffffffffff0) + 0xd0;
        local_fb0 = 0;
        uVar17 = 0;
        goto LAB_011e1987;
      }
      auVar28 = vmaxps_avx(auVar32,*(undefined1 (*) [16])(uVar17 + 0x20));
      auVar29 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar17 + 0x30));
      auVar28 = vmaxps_avx(auVar34,*(undefined1 (*) [16])(uVar17 + 0x40));
      auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar17 + 0x50));
      auVar29 = vsubps_avx(auVar29,auVar32);
      auVar30 = vsubps_avx(auVar28,auVar34);
      auVar28 = vmaxps_avx(auVar33._0_16_,*(undefined1 (*) [16])(uVar17 + 0x60));
      auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar17 + 0x70));
      auVar28 = vsubps_avx(auVar28,auVar33._0_16_);
      local_1008._0_4_ =
           auVar29._0_4_ * auVar29._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
           auVar28._0_4_ * auVar28._0_4_;
      local_1008._4_4_ =
           auVar29._4_4_ * auVar29._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
           auVar28._4_4_ * auVar28._4_4_;
      fStack_1000 = auVar29._8_4_ * auVar29._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
                    auVar28._8_4_ * auVar28._8_4_;
      fStack_ffc = auVar29._12_4_ * auVar29._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
                   auVar28._12_4_ * auVar28._12_4_;
      auVar28 = vcmpps_avx(_local_1008,auVar23,2);
      auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x20),
                           *(undefined1 (*) [16])(uVar17 + 0x30),2);
      auVar28 = vandps_avx(auVar28,auVar29);
    }
    else {
      if ((uVar17 & 8) != 0) goto LAB_011e1964;
      auVar28 = *(undefined1 (*) [16])(uVar17 + 0x20);
      auVar29 = *(undefined1 (*) [16])(uVar17 + 0x30);
      auVar30 = vmaxps_avx(auVar32,auVar28);
      auVar30 = vminps_avx(auVar30,auVar29);
      auVar8 = vsubps_avx(auVar30,auVar32);
      auVar30 = vmaxps_avx(auVar34,*(undefined1 (*) [16])(uVar17 + 0x40));
      auVar30 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar17 + 0x50));
      auVar31 = vsubps_avx(auVar30,auVar34);
      auVar30 = vmaxps_avx(local_fe8,*(undefined1 (*) [16])(uVar17 + 0x60));
      auVar30 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar17 + 0x70));
      auVar30 = vsubps_avx(auVar30,local_fe8);
      local_1008._4_4_ =
           auVar8._4_4_ * auVar8._4_4_ + auVar31._4_4_ * auVar31._4_4_ +
           auVar30._4_4_ * auVar30._4_4_;
      local_1008._0_4_ =
           auVar8._0_4_ * auVar8._0_4_ + auVar31._0_4_ * auVar31._0_4_ +
           auVar30._0_4_ * auVar30._0_4_;
      fStack_1000 = auVar8._8_4_ * auVar8._8_4_ + auVar31._8_4_ * auVar31._8_4_ +
                    auVar30._8_4_ * auVar30._8_4_;
      fStack_ffc = auVar8._12_4_ * auVar8._12_4_ + auVar31._12_4_ * auVar31._12_4_ +
                   auVar30._12_4_ * auVar30._12_4_;
      auVar30 = vcmpps_avx(auVar28,auVar29,2);
      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x50),auVar11,5);
      auVar30 = vandps_avx(auVar30,auVar8);
      auVar33 = ZEXT1664(local_fe8);
      auVar28 = vcmpps_avx(auVar28,auVar24,2);
      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x40),auVar26,2);
      auVar28 = vandps_avx(auVar8,auVar28);
      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x70),auVar12,5);
      auVar30 = vandps_avx(auVar30,auVar8);
      auVar29 = vcmpps_avx(auVar29,auVar10,5);
      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x60),auVar27,2);
      auVar29 = vandps_avx(auVar29,auVar8);
      auVar28 = vandps_avx(auVar28,auVar29);
      auVar28 = vandps_avx(auVar30,auVar28);
    }
    auVar28 = vpslld_avx(auVar28,0x1f);
    uVar16 = vmovmskps_avx(auVar28);
    if (uVar16 != 0) {
      uVar16 = uVar16 & 0xff;
      uVar18 = uVar17 & 0xfffffffffffffff0;
      lVar19 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar17 = *(ulong *)(uVar18 + lVar19 * 8);
      uVar16 = uVar16 - 1 & uVar16;
      if (uVar16 != 0) {
        uVar5 = *(uint *)(local_1008 + lVar19 * 4);
        lVar19 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar7 = *(ulong *)(uVar18 + lVar19 * 8);
        uVar6 = *(uint *)(local_1008 + lVar19 * 4);
        uVar16 = uVar16 - 1 & uVar16;
        if (uVar16 == 0) {
          if (uVar5 < uVar6) {
            *(ulong *)*pauVar21 = uVar7;
            *(uint *)(*pauVar21 + 8) = uVar6;
            pauVar21 = pauVar21 + 1;
          }
          else {
            *(ulong *)*pauVar21 = uVar17;
            *(uint *)(*pauVar21 + 8) = uVar5;
            uVar17 = uVar7;
            pauVar21 = pauVar21 + 1;
          }
        }
        else {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar17;
          auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar5));
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar7;
          auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar6));
          lVar19 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
          auVar8 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_1008 + lVar19 * 4)));
          auVar30 = vpcmpgtd_avx(auVar29,auVar28);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 == 0) {
            auVar31 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar29,auVar28,auVar31);
            auVar28 = vblendvps_avx(auVar28,auVar29,auVar31);
            auVar29 = vpcmpgtd_avx(auVar8,auVar30);
            auVar31 = vpshufd_avx(auVar29,0xaa);
            auVar29 = vblendvps_avx(auVar8,auVar30,auVar31);
            auVar30 = vblendvps_avx(auVar30,auVar8,auVar31);
            auVar8 = vpcmpgtd_avx(auVar30,auVar28);
            auVar31 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar30,auVar28,auVar31);
            auVar28 = vblendvps_avx(auVar28,auVar30,auVar31);
            *pauVar21 = auVar28;
            pauVar21[1] = auVar8;
            uVar17 = auVar29._0_8_;
            pauVar21 = pauVar21 + 2;
          }
          else {
            lVar19 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
            auVar9 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1008 + lVar19 * 4)));
            auVar31 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar29,auVar28,auVar31);
            auVar28 = vblendvps_avx(auVar28,auVar29,auVar31);
            auVar29 = vpcmpgtd_avx(auVar9,auVar8);
            auVar31 = vpshufd_avx(auVar29,0xaa);
            auVar29 = vblendvps_avx(auVar9,auVar8,auVar31);
            auVar8 = vblendvps_avx(auVar8,auVar9,auVar31);
            auVar31 = vpcmpgtd_avx(auVar8,auVar28);
            auVar9 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar8,auVar28,auVar9);
            auVar28 = vblendvps_avx(auVar28,auVar8,auVar9);
            auVar8 = vpcmpgtd_avx(auVar29,auVar30);
            auVar9 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar29,auVar30,auVar9);
            auVar29 = vblendvps_avx(auVar30,auVar29,auVar9);
            auVar30 = vpcmpgtd_avx(auVar31,auVar29);
            auVar9 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar31,auVar29,auVar9);
            auVar29 = vblendvps_avx(auVar29,auVar31,auVar9);
            *pauVar21 = auVar28;
            pauVar21[1] = auVar29;
            pauVar21[2] = auVar30;
            uVar17 = auVar8._0_8_;
            pauVar21 = pauVar21 + 3;
          }
        }
      }
      goto LAB_011e1630;
    }
    if (pauVar21 == (undefined1 (*) [16])&local_f78) {
      return bVar15;
    }
  }
  auVar25 = ZEXT1664(local_fd8);
  goto LAB_011e1a81;
LAB_011e1987:
  do {
    local_fb8 = uVar17;
    lVar20 = -4;
    bVar22 = 0;
    do {
      uVar16 = *(uint *)(lVar19 + lVar20 * 4);
      if ((ulong)uVar16 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar16].ptr;
      context->geomID = uVar16;
      context->primID = *(uint *)(lVar19 + 0x10 + lVar20 * 4);
      bVar14 = Geometry::pointQuery(this,query,context);
      auVar33 = ZEXT1664(local_fe8);
      auVar35 = ZEXT1664(local_f88);
      bVar22 = bVar22 | bVar14;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
    uVar17 = CONCAT71((int7)(local_fb8 >> 8),(byte)local_fb8 | bVar22);
    local_fb0 = local_fb0 + 1;
    lVar19 = lVar19 + 0xe0;
  } while (local_fb0 != local_fc0);
  if ((local_fb8 & 1) == 0 && bVar22 == 0) {
    auVar25 = ZEXT1664(local_fd8);
  }
  else {
    uVar3 = *(undefined4 *)&(context->query_radius).field_0;
    auVar25 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    local_f98 = (context->query_radius).field_0.m128[1];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    local_fa8 = (context->query_radius).field_0.m128[2];
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_ff8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      local_ff8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    }
    bVar15 = true;
  }
LAB_011e1a81:
  auVar23._0_4_ = auVar25._0_4_ * auVar25._0_4_;
  auVar23._4_4_ = auVar25._4_4_ * auVar25._4_4_;
  auVar23._8_4_ = auVar25._8_4_ * auVar25._8_4_;
  auVar23._12_4_ = auVar25._12_4_ * auVar25._12_4_;
  if (pauVar21 == (undefined1 (*) [16])&local_f78) {
    return bVar15;
  }
  goto LAB_011e15e6;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }